

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_hash.c
# Opt level: O3

void gravity_hash_iterate3
               (gravity_hash_t *hashtable,gravity_hash_iterate3_fn iterate,void *data1,void *data2,
               void *data3)

{
  uint uVar1;
  ulong uVar2;
  hash_node_s *phVar3;
  
  if ((iterate != (gravity_hash_iterate3_fn)0x0 && hashtable != (gravity_hash_t *)0x0) &&
     (uVar1 = hashtable->size, uVar1 != 0)) {
    uVar2 = 0;
    do {
      phVar3 = hashtable->nodes[uVar2];
      if (phVar3 != (hash_node_t *)0x0) {
        do {
          (*iterate)(hashtable,phVar3->key,phVar3->value,data1,data2,data3);
          phVar3 = phVar3->next;
        } while (phVar3 != (hash_node_s *)0x0);
        uVar1 = hashtable->size;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar1);
  }
  return;
}

Assistant:

void gravity_hash_iterate3 (gravity_hash_t *hashtable, gravity_hash_iterate3_fn iterate, void *data1, void *data2, void *data3) {
    if ((!hashtable) || (!iterate)) return;
    
    for (uint32_t i=0; i<hashtable->size; ++i) {
        hash_node_t *node = hashtable->nodes[i];
        if (!node) continue;
        
        while (node) {
            iterate(hashtable, node->key, node->value, data1, data2, data3);
            node = node->next;
        }
    }
}